

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

void __thiscall
IntrusiveList<MemberHandle>::push_back(IntrusiveList<MemberHandle> *this,MemberHandle *node)

{
  MemberHandle **ppMVar1;
  bool bVar2;
  
  if (node == (MemberHandle *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<MemberHandle>::push_back(T *) [T = MemberHandle]");
  }
  if (node->next == (MemberHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (MemberHandle *)0x0;
      ppMVar1 = &this->tail->next;
      if (!bVar2) {
        ppMVar1 = &this->tail;
      }
      *ppMVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,"void IntrusiveList<MemberHandle>::push_back(T *) [T = MemberHandle]");
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<MemberHandle>::push_back(T *) [T = MemberHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}